

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::MoveArgs(Instr *this,bool generateByteCodeCapture)

{
  code *pcVar1;
  anon_class_16_2_81eb02f8 callback;
  bool bVar2;
  undefined4 *puVar3;
  Instr *local_20;
  Instr *argInsertInstr;
  Instr *pIStack_10;
  bool generateByteCodeCapture_local;
  Instr *this_local;
  
  argInsertInstr._7_1_ = generateByteCodeCapture;
  pIStack_10 = this;
  if ((((this->m_opcode != InlineeStart) && (this->m_opcode != CallDirect)) &&
      (this->m_opcode != CallI)) && (this->m_opcode != CallIFixed)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd81,
                       "(this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect || this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed)"
                       ,
                       "this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect || this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  callback.argInsertInstr = &local_20;
  callback.generateByteCodeCapture = (bool *)((long)&argInsertInstr + 7);
  local_20 = this;
  IterateArgInstrs<IR::Instr::MoveArgs(bool)::__0>(this,callback);
  return;
}

Assistant:

void Instr::MoveArgs(bool generateByteCodeCapture)
{
    Assert(this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect ||
        this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed);
    IR::Instr *argInsertInstr = this;
    this->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        if (generateByteCodeCapture)
        {
            argInstr->GenerateBytecodeArgOutCapture();
        }
        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;
        return false;
    });
}